

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O2

void predict_iforest<float,int>
               (float *numeric_data,int *categ_data,bool is_col_major,size_t ld_numeric,
               size_t ld_categ,float *Xc,int *Xc_ind,int *Xc_indptr,float *Xr,int *Xr_ind,
               int *Xr_indptr,size_t nrows,int nthreads,bool standardize,IsoForest *model_outputs,
               ExtIsoForest *model_outputs_ext,double *output_depths,int *tree_num,
               double *per_tree_depths,TreesIndexer *indexer)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pSVar4;
  pointer puVar5;
  bool bVar6;
  size_t row_1;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  size_t sVar10;
  ScoringMetric SVar11;
  int *piVar12;
  size_t tree;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  int nthreads_00;
  ExtIsoForest *pEVar16;
  double *pdVar17;
  size_t tree_1;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  exception_ptr ex;
  double local_c0;
  PredictionData<float,_int> prediction_data;
  
  if (nrows == 0) {
    return;
  }
  prediction_data.nrows = nrows;
  prediction_data.Xc_ind = Xc_ind;
  prediction_data.Xc_indptr = Xc_indptr;
  prediction_data.Xr = Xr;
  prediction_data.Xr_ind = Xr_ind;
  prediction_data.Xr_indptr = Xr_indptr;
  nthreads_00 = (int)nrows;
  if ((ulong)(long)nthreads <= nrows) {
    nthreads_00 = nthreads;
  }
  prediction_data.numeric_data = numeric_data;
  prediction_data.categ_data = categ_data;
  prediction_data.is_col_major = is_col_major;
  prediction_data.ncols_numeric = ld_numeric;
  prediction_data.ncols_categ = ld_categ;
  prediction_data.Xc = Xc;
  if ((categ_data == (int *)0x0 || is_col_major) && Xc_indptr != (int *)0x0) {
    batched_csc_predict<float,int>
              (&prediction_data,nthreads,model_outputs,model_outputs_ext,output_depths,tree_num,
               per_tree_depths);
LAB_001393d8:
    if (model_outputs != (IsoForest *)0x0) goto LAB_001393e9;
    lVar9 = ((long)(model_outputs_ext->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    auVar24._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar24._0_8_ = lVar9;
    auVar24._12_4_ = 0x45300000;
    dVar25 = (auVar24._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0);
    local_c0 = model_outputs_ext->exp_avg_depth * dVar25;
    SVar11 = model_outputs_ext->scoring_metric;
    bVar18 = SVar11 == Density;
    bVar19 = SVar11 == BoxedRatio;
    bVar20 = SVar11 == BoxedDensity;
    bVar6 = true;
LAB_00139527:
    bVar21 = SVar11 == BoxedDensity2;
  }
  else {
    if (model_outputs == (IsoForest *)0x0) {
      if ((((Xc_indptr == (int *)0x0) && (model_outputs_ext->missing_action == Fail)) &&
          (Xr_indptr == (int *)0x0)) &&
         ((categ_data == (int *)0x0 && (model_outputs_ext->has_range_penalty == false)))) {
        if (nrows == 1 || !is_col_major) {
          lVar9 = 0;
          for (sVar10 = 0; sVar10 != nrows; sVar10 = sVar10 + 1) {
            ex._M_exception_object = (void *)0x0;
            lVar15 = 0;
            uVar13 = 0;
            piVar14 = tree_num;
            pdVar17 = per_tree_depths;
            while( true ) {
              pvVar2 = (model_outputs_ext->hplanes).
                       super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar7 = ((long)(model_outputs_ext->hplanes).
                             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18;
              if (uVar7 <= uVar13) break;
              piVar12 = piVar14;
              if (tree_num == (int *)0x0) {
                piVar12 = tree_num;
              }
              pdVar8 = (double *)(uVar7 * lVar9 + (long)pdVar17);
              if (per_tree_depths == (double *)0x0) {
                pdVar8 = (double *)0x0;
              }
              traverse_hplane_fast_rowmajor<float,int>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&(pvVar2->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)
                                 ._M_impl + lVar15),model_outputs_ext,
                         prediction_data.numeric_data + prediction_data.ncols_numeric * sVar10,
                         (double *)&ex,piVar12,pdVar8,sVar10);
              uVar13 = uVar13 + 1;
              lVar15 = lVar15 + 0x18;
              pdVar17 = pdVar17 + 1;
              piVar14 = piVar14 + nrows;
            }
            output_depths[sVar10] = (double)ex._M_exception_object;
            lVar9 = lVar9 + 8;
          }
        }
        else {
          lVar9 = 0;
          for (sVar10 = 0; sVar10 != nrows; sVar10 = sVar10 + 1) {
            ex._M_exception_object = (void *)0x0;
            lVar15 = 0;
            uVar13 = 0;
            piVar14 = tree_num;
            pdVar17 = per_tree_depths;
            while( true ) {
              pvVar2 = (model_outputs_ext->hplanes).
                       super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar7 = ((long)(model_outputs_ext->hplanes).
                             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18;
              if (uVar7 <= uVar13) break;
              piVar12 = piVar14;
              if (tree_num == (int *)0x0) {
                piVar12 = tree_num;
              }
              pdVar8 = (double *)(uVar7 * lVar9 + (long)pdVar17);
              if (per_tree_depths == (double *)0x0) {
                pdVar8 = (double *)0x0;
              }
              traverse_hplane_fast_colmajor<PredictionData<float,int>,int>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&(pvVar2->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)
                                 ._M_impl + lVar15),model_outputs_ext,&prediction_data,(double *)&ex
                         ,piVar12,pdVar8,sVar10);
              uVar13 = uVar13 + 1;
              lVar15 = lVar15 + 0x18;
              pdVar17 = pdVar17 + 1;
              piVar14 = piVar14 + nrows;
            }
            output_depths[sVar10] = (double)ex._M_exception_object;
            lVar9 = lVar9 + 8;
          }
        }
      }
      else {
        lVar9 = 0;
        for (sVar10 = 0; sVar10 != nrows; sVar10 = sVar10 + 1) {
          ex._M_exception_object = (void *)0x0;
          lVar15 = 0;
          uVar13 = 0;
          piVar14 = tree_num;
          pdVar17 = per_tree_depths;
          while( true ) {
            pvVar2 = (model_outputs_ext->hplanes).
                     super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar7 = ((long)(model_outputs_ext->hplanes).
                           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18;
            if (uVar7 <= uVar13) break;
            piVar12 = piVar14;
            if (tree_num == (int *)0x0) {
              piVar12 = tree_num;
            }
            pdVar8 = (double *)(uVar7 * lVar9 + (long)pdVar17);
            if (per_tree_depths == (double *)0x0) {
              pdVar8 = (double *)0x0;
            }
            traverse_hplane<PredictionData<float,int>,int,ImputedData<int,double>>
                      ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                       ((long)&(pvVar2->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                               _M_impl + lVar15),model_outputs_ext,&prediction_data,(double *)&ex,
                       (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                       (ImputedData<int,_double> *)0x0,piVar12,pdVar8,sVar10);
            uVar13 = uVar13 + 1;
            lVar15 = lVar15 + 0x18;
            pdVar17 = pdVar17 + 1;
            piVar14 = piVar14 + nrows;
          }
          output_depths[sVar10] = (double)ex._M_exception_object;
          lVar9 = lVar9 + 8;
        }
      }
      goto LAB_001393d8;
    }
    if (model_outputs->missing_action != Fail) {
LAB_0013925a:
      ex._M_exception_object = (void *)0x0;
      lVar9 = 0;
      for (sVar10 = 0; sVar10 != nrows; sVar10 = sVar10 + 1) {
        dVar25 = 0.0;
        lVar15 = 0;
        uVar13 = 0;
        piVar14 = tree_num;
        pdVar17 = per_tree_depths;
        while( true ) {
          pvVar1 = (model_outputs->trees).
                   super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = ((long)(model_outputs->trees).
                         super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
          if (uVar7 <= uVar13) break;
          piVar12 = piVar14;
          if (tree_num == (int *)0x0) {
            piVar12 = tree_num;
          }
          pdVar8 = (double *)(uVar7 * lVar9 + (long)pdVar17);
          if (per_tree_depths == (double *)0x0) {
            pdVar8 = (double *)0x0;
          }
          dVar22 = traverse_itree<PredictionData<float,int>,int,ImputedData<int,double>>
                             ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                              ((long)&(pvVar1->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>
                                      )._M_impl + lVar15),model_outputs,&prediction_data,
                              (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                              (ImputedData<int,_double> *)0x0,0.0,sVar10,piVar12,pdVar8,0);
          dVar25 = dVar25 + dVar22;
          uVar13 = uVar13 + 1;
          lVar15 = lVar15 + 0x18;
          pdVar17 = pdVar17 + 1;
          piVar14 = piVar14 + nrows;
        }
        output_depths[sVar10] = dVar25;
        lVar9 = lVar9 + 8;
      }
      std::__exception_ptr::exception_ptr::~exception_ptr(&ex);
      goto LAB_001393d8;
    }
    if (model_outputs->new_cat_action == Weighted) {
      if (((Xc_indptr == (int *)0x0) && (Xr_indptr == (int *)0x0)) &&
         (categ_data == (int *)0x0 || model_outputs->cat_split_type == SingleCateg))
      goto LAB_00139a9c;
      goto LAB_0013925a;
    }
    if (Xc_indptr != (int *)0x0 || Xr_indptr != (int *)0x0) goto LAB_0013925a;
LAB_00139a9c:
    if (model_outputs->has_range_penalty != false) goto LAB_0013925a;
    if ((nrows == 1 || !is_col_major) && categ_data == (int *)0x0) {
      lVar9 = 0;
      for (sVar10 = 0; sVar10 != nrows; sVar10 = sVar10 + 1) {
        ex._M_exception_object = (void *)0x0;
        lVar15 = 0;
        uVar13 = 0;
        piVar14 = tree_num;
        pdVar17 = per_tree_depths;
        while( true ) {
          pvVar1 = (model_outputs->trees).
                   super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = ((long)(model_outputs->trees).
                         super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
          if (uVar7 <= uVar13) break;
          piVar12 = piVar14;
          if (tree_num == (int *)0x0) {
            piVar12 = tree_num;
          }
          pdVar8 = (double *)(uVar7 * lVar9 + (long)pdVar17);
          if (per_tree_depths == (double *)0x0) {
            pdVar8 = (double *)0x0;
          }
          traverse_itree_fast<float,int>
                    ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                     ((long)&(pvVar1->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl
                     + lVar15),model_outputs,
                     prediction_data.numeric_data + prediction_data.ncols_numeric * sVar10,
                     (double *)&ex,piVar12,pdVar8,sVar10);
          uVar13 = uVar13 + 1;
          lVar15 = lVar15 + 0x18;
          pdVar17 = pdVar17 + 1;
          piVar14 = piVar14 + nrows;
        }
        output_depths[sVar10] = (double)ex._M_exception_object;
        lVar9 = lVar9 + 8;
      }
    }
    else {
      lVar9 = 0;
      for (sVar10 = 0; sVar10 != nrows; sVar10 = sVar10 + 1) {
        ex._M_exception_object = (void *)0x0;
        lVar15 = 0;
        uVar13 = 0;
        piVar14 = tree_num;
        pdVar17 = per_tree_depths;
        while( true ) {
          pvVar1 = (model_outputs->trees).
                   super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = ((long)(model_outputs->trees).
                         super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
          if (uVar7 <= uVar13) break;
          piVar12 = piVar14;
          if (tree_num == (int *)0x0) {
            piVar12 = tree_num;
          }
          pdVar8 = (double *)(uVar7 * lVar9 + (long)pdVar17);
          if (per_tree_depths == (double *)0x0) {
            pdVar8 = (double *)0x0;
          }
          traverse_itree_no_recurse<PredictionData<float,int>,int>
                    ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                     ((long)&(pvVar1->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl
                     + lVar15),model_outputs,&prediction_data,(double *)&ex,piVar12,pdVar8,sVar10);
          uVar13 = uVar13 + 1;
          lVar15 = lVar15 + 0x18;
          pdVar17 = pdVar17 + 1;
          piVar14 = piVar14 + nrows;
        }
        output_depths[sVar10] = (double)ex._M_exception_object;
        lVar9 = lVar9 + 8;
      }
    }
LAB_001393e9:
    lVar9 = ((long)(model_outputs->trees).
                   super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model_outputs->trees).
                  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    auVar23._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar23._0_8_ = lVar9;
    auVar23._12_4_ = 0x45300000;
    dVar25 = (auVar23._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0);
    local_c0 = model_outputs->exp_avg_depth * dVar25;
    SVar11 = model_outputs->scoring_metric;
    bVar18 = SVar11 == Density;
    if (bVar18) {
      if (model_outputs_ext != (ExtIsoForest *)0x0) {
        bVar19 = model_outputs_ext->scoring_metric == BoxedRatio;
        bVar18 = true;
LAB_00139514:
        bVar20 = model_outputs_ext->scoring_metric == BoxedDensity;
LAB_0013951c:
        SVar11 = model_outputs_ext->scoring_metric;
        bVar6 = false;
        goto LAB_00139527;
      }
      bVar19 = false;
LAB_00139676:
      bVar21 = SVar11 == BoxedDensity2;
      bVar20 = false;
LAB_0013967f:
      bVar6 = false;
    }
    else {
      if (model_outputs_ext != (ExtIsoForest *)0x0) {
        bVar18 = model_outputs_ext->scoring_metric == Density;
        bVar19 = true;
        if (SVar11 == BoxedRatio) goto LAB_00139514;
        bVar19 = model_outputs_ext->scoring_metric == BoxedRatio;
        bVar20 = true;
        if ((SVar11 == BoxedDensity) ||
           (bVar20 = model_outputs_ext->scoring_metric == BoxedDensity, SVar11 != BoxedDensity2))
        goto LAB_0013951c;
        bVar21 = true;
        goto LAB_0013967f;
      }
      bVar19 = SVar11 == BoxedRatio;
      if (SVar11 != BoxedDensity) goto LAB_00139676;
      bVar20 = true;
      bVar18 = false;
      bVar6 = false;
      bVar21 = false;
    }
  }
  if (standardize) {
    if (bVar18 || bVar21) {
      for (sVar10 = 0; nrows != sVar10; sVar10 = sVar10 + 1) {
        output_depths[sVar10] = output_depths[sVar10] / -dVar25;
      }
    }
    else if (bVar20) {
      for (sVar10 = 0; nrows != sVar10; sVar10 = sVar10 + 1) {
        dVar22 = exp(output_depths[sVar10] / dVar25);
        output_depths[sVar10] = -dVar22;
      }
    }
    else if (bVar19) {
      for (sVar10 = 0; nrows != sVar10; sVar10 = sVar10 + 1) {
        output_depths[sVar10] = output_depths[sVar10] / dVar25;
      }
    }
    else {
      for (sVar10 = 0; nrows != sVar10; sVar10 = sVar10 + 1) {
        dVar25 = exp2(-output_depths[sVar10] / local_c0);
        output_depths[sVar10] = dVar25;
      }
    }
  }
  else if ((bool)(bVar18 | bVar20 | bVar21)) {
    for (sVar10 = 0; nrows != sVar10; sVar10 = sVar10 + 1) {
      dVar22 = exp(output_depths[sVar10] / dVar25);
      output_depths[sVar10] = dVar22;
    }
  }
  else if (bVar19) {
    for (sVar10 = 0; nrows != sVar10; sVar10 = sVar10 + 1) {
      output_depths[sVar10] = output_depths[sVar10] / -dVar25;
    }
  }
  else {
    for (sVar10 = 0; nrows != sVar10; sVar10 = sVar10 + 1) {
      output_depths[sVar10] = output_depths[sVar10] / dVar25;
    }
  }
  if ((per_tree_depths != (double *)0x0) && ((bVar18 || bVar20) || bVar21)) {
    pEVar16 = (ExtIsoForest *)model_outputs;
    if (bVar6) {
      pEVar16 = model_outputs_ext;
    }
    pvVar2 = (pEVar16->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar3 = (pEVar16->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar9 = 0; (((long)pvVar2 - (long)pvVar3) / 0x18) * nrows - lVar9 != 0; lVar9 = lVar9 + 1)
    {
      dVar25 = exp(per_tree_depths[lVar9]);
      per_tree_depths[lVar9] = dVar25;
    }
  }
  if (tree_num == (int *)0x0) {
    return;
  }
  if ((indexer == (TreesIndexer *)0x0) ||
     (pSVar4 = (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_start,
     pSVar4 == (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_finish)) {
LAB_00139900:
    remap_terminal_trees<PredictionData<float,int>,int>
              (model_outputs,model_outputs_ext,&prediction_data,tree_num,nthreads_00);
  }
  else {
    if (bVar6) {
      lVar9 = (long)(model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
    }
    else if ((model_outputs->missing_action == Divide) ||
            (((lVar9 = (long)(model_outputs->trees).
                             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(model_outputs->trees).
                             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
              model_outputs->new_cat_action == Weighted && (categ_data != (int *)0x0)) &&
             (model_outputs->cat_split_type == SubSet)))) goto LAB_00139900;
    for (lVar15 = 0; lVar15 != lVar9 / 0x18; lVar15 = lVar15 + 1) {
      puVar5 = pSVar4[lVar15].terminal_node_mappings.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar10 = 0; nrows != sVar10; sVar10 = sVar10 + 1) {
        tree_num[sVar10] = (int)puVar5[tree_num[sVar10]];
      }
      tree_num = tree_num + nrows;
    }
  }
  return;
}

Assistant:

void predict_iforest(real_t *restrict numeric_data, int *restrict categ_data,
                     bool is_col_major, size_t ld_numeric, size_t ld_categ,
                     real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     real_t *restrict Xr, sparse_ix *restrict Xr_ind, sparse_ix *restrict Xr_indptr,
                     size_t nrows, int nthreads, bool standardize,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double *restrict output_depths,   sparse_ix *restrict tree_num,
                     double *restrict per_tree_depths,
                     TreesIndexer *indexer)
{
    if (unlikely(!nrows)) return;

    /* put data in a struct for passing it in fewer lines */
    PredictionData<real_t, sparse_ix>
                   prediction_data = {numeric_data, categ_data, nrows,
                                      is_col_major, ld_numeric, ld_categ,
                                      Xc, Xc_ind, Xc_indptr,
                                      Xr, Xr_ind, Xr_indptr};

    int nthreads_orig = nthreads;
    if ((size_t)nthreads > nrows)
        nthreads = nrows;

    /* For batch predictions of sparse CSC, will take a specialized route */
    if (prediction_data.Xc_indptr != NULL && (prediction_data.categ_data == NULL || prediction_data.is_col_major))
    {
        batched_csc_predict(prediction_data, nthreads_orig,
                            model_outputs, model_outputs_ext,
                            output_depths, tree_num,
                            per_tree_depths);
    }

    /* Regular case (no specialized CSC route) */
    else if (model_outputs != NULL)
    {
        if (
            model_outputs->missing_action == Fail &&
            (model_outputs->new_cat_action != Weighted || model_outputs->cat_split_type == SingleCateg || prediction_data.categ_data == NULL) &&
            prediction_data.Xc_indptr == NULL && prediction_data.Xr_indptr == NULL &&
            !model_outputs->has_range_penalty
            )
        {
            if (prediction_data.categ_data == NULL && (nrows == 1 || !prediction_data.is_col_major))
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        traverse_itree_fast(model_outputs->trees[tree],
                                            *model_outputs,
                                            prediction_data.numeric_data + row * prediction_data.ncols_numeric,
                                            score,
                                            (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                            (per_tree_depths == NULL)?
                                                NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                            (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }

            else
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        traverse_itree_no_recurse(model_outputs->trees[tree],
                                                  *model_outputs,
                                                  prediction_data,
                                                  score,
                                                  (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                  (per_tree_depths == NULL)?
                                                      NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                                  (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }
        }

        else
        {
            bool threw_exception = false;
            std::exception_ptr ex = NULL;

            #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                    shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths, threw_exception, ex)
            for (size_t_for row = 0; row < (decltype(row))nrows; row++)
            {
                if (threw_exception) continue;
                double score = 0;
                try
                {
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        score += traverse_itree(model_outputs->trees[tree],
                                                *model_outputs,
                                                prediction_data,
                                                (std::vector<ImputeNode>*)NULL,
                                                (ImputedData<sparse_ix, double>*)NULL,
                                                (double)0,
                                                (size_t) row,
                                                (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                (per_tree_depths == NULL)?
                                                    NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                                (size_t) 0);
                    }
                    output_depths[row] = score;
                }
                catch (...)
                {
                    #pragma omp critical
                    {
                        if (!threw_exception)
                        {
                            threw_exception = true;
                            ex = std::current_exception();
                        }
                    }
                }
            }

            if (threw_exception)
                std::rethrow_exception(ex);
        }
    }
    

    else
    {
        if (
            model_outputs_ext->missing_action == Fail &&
            prediction_data.categ_data == NULL &&
            prediction_data.Xc_indptr == NULL &&
            prediction_data.Xr_indptr == NULL &&
            !model_outputs_ext->has_range_penalty
            )
        {
            if (prediction_data.is_col_major && nrows > 1)
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                    {
                        traverse_hplane_fast_colmajor(model_outputs_ext->hplanes[tree],
                                                      *model_outputs_ext,
                                                      prediction_data,
                                                      score,
                                                      (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                      (per_tree_depths == NULL)?
                                                            NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                                      (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }

            else
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                    {
                        traverse_hplane_fast_rowmajor(model_outputs_ext->hplanes[tree],
                                                      *model_outputs_ext,
                                                      prediction_data.numeric_data + row * prediction_data.ncols_numeric,
                                                      score,
                                                      (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                      (per_tree_depths == NULL)?
                                                            NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                                      (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }
        }

        else
        {
            #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                    shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
            for (size_t_for row = 0; row < (decltype(row))nrows; row++)
            {
                double score = 0;
                for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                {
                    traverse_hplane(model_outputs_ext->hplanes[tree],
                                    *model_outputs_ext,
                                    prediction_data,
                                    score,
                                    (std::vector<ImputeNode>*)NULL,
                                    (ImputedData<sparse_ix, double>*)NULL,
                                    (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                    (per_tree_depths == NULL)?
                                        NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                    (size_t) row);
                }
                output_depths[row] = score;
            }
        }
    }

    /* translate sum-of-depths to outlier score */
    double ntrees, depth_divisor;
    if (model_outputs != NULL)
    {
        ntrees = (double) model_outputs->trees.size();
        depth_divisor = ntrees * (model_outputs->exp_avg_depth);
    }

    else
    {
        ntrees = (double) model_outputs_ext->hplanes.size();
        depth_divisor = ntrees * (model_outputs_ext->exp_avg_depth);
    }

    
    /* for density and boxed_ratio, each tree will have 'log(d)'' instead of 'd' */
    bool is_density = (model_outputs != NULL && model_outputs->scoring_metric == Density) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == Density);
    bool is_bratio  = (model_outputs != NULL && model_outputs->scoring_metric == BoxedRatio) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedRatio);
    bool is_bdens   = (model_outputs != NULL && model_outputs->scoring_metric == BoxedDensity) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedDensity);
    bool is_bdens2  = (model_outputs != NULL && model_outputs->scoring_metric == BoxedDensity2) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedDensity2);

    if (standardize)
    {
        if (is_density || is_bdens2)
        {
            ntrees = -ntrees;
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }

        else if (is_bdens)
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = -std::exp(output_depths[row] / ntrees);
        }

        else if (is_bratio)
        {
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = output_depths[row] / ntrees;
        }

        else
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = std::exp2( - output_depths[row] / depth_divisor );
        }
    }

    else
    {
        if (is_density || is_bdens || is_bdens2)
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = std::exp(output_depths[row] / ntrees);
        }

        else if (is_bratio)
        {
            ntrees = -ntrees;
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }

        else
        {
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }
    }

    if (per_tree_depths != NULL && (is_density || is_bdens || is_bdens2))
    {
        size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
        #ifndef _WIN32
        #pragma omp simd
        #endif
        for (size_t ix = 0; ix < nrows*ntrees; ix++)
            per_tree_depths[ix] = std::exp(per_tree_depths[ix]);
    }


    /* re-map tree numbers to start at zero (if predicting tree numbers) */
    /* Note: usually this type of 'prediction' is not required,
       thus this mapping is not stored in the model objects so as to
       save memory */
    if (tree_num != NULL)
    {
        if (indexer != NULL && !indexer->indices.empty())
        {
            size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
            if (model_outputs != NULL)
            {
                if (model_outputs->missing_action == Divide)
                    goto manual_remap;
                if (model_outputs->new_cat_action == Weighted && model_outputs->cat_split_type == SubSet && categ_data != NULL)
                    goto manual_remap;
            }

            for (size_t tree = 0; tree < ntrees; tree++)
            {
                size_t *restrict mapping = indexer->indices[tree].terminal_node_mappings.data();
                for (size_t row = 0; row < nrows; row++)
                {
                    tree_num[row + tree*nrows] = mapping[tree_num[row + tree*nrows]];
                }
            }
        }

        else
        {
            manual_remap:
            remap_terminal_trees(model_outputs, model_outputs_ext,
                                 prediction_data, tree_num, nthreads);
        }
    }
}